

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall TPZFMatrix<float>::Substitution(TPZFMatrix<float> *this,TPZFMatrix<float> *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  ulong local_58;
  
  if ((this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar1 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  uVar2 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  if (uVar1 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < (long)uVar1) {
    uVar8 = 0;
    do {
      if (0 < (long)uVar2) {
        pfVar4 = this->fElem;
        uVar13 = 0;
        do {
          if (uVar8 != 0) {
            pfVar5 = B->fElem;
            lVar10 = (uVar13 & 0xffffffff) * uVar1;
            fVar15 = pfVar5[lVar10 + uVar8];
            uVar12 = 0;
            do {
              fVar15 = fVar15 - pfVar4[uVar8 + (uVar12 & 0xffffffff) * uVar3] *
                                *(float *)((long)pfVar5 +
                                          uVar12 * 4 + (uVar13 & 0xffffffff) * uVar1 * 4);
              pfVar5[lVar10 + uVar8] = fVar15;
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar2);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
  }
  if (0 < (long)uVar2) {
    local_58 = 0;
    do {
      if (0 < (long)uVar1) {
        lVar9 = ((local_58 & 0xffffffff) * 4 + 4) * uVar1;
        lVar10 = (local_58 & 0xffffffff) * uVar1;
        lVar14 = 0;
        uVar8 = uVar1;
        do {
          uVar13 = uVar8 - 1;
          if ((long)uVar8 < (long)uVar1) {
            pfVar4 = B->fElem;
            pfVar5 = this->fElem;
            fVar15 = pfVar4[lVar10 + uVar13];
            lVar11 = 0;
            do {
              fVar15 = fVar15 - pfVar5[uVar13 + (uint)((int)uVar8 + (int)lVar11) * uVar3] *
                                *(float *)((long)pfVar4 + lVar11 * 4 + lVar9);
              pfVar4[lVar10 + uVar13] = fVar15;
              lVar11 = lVar11 + 1;
            } while (lVar14 != lVar11);
          }
          lVar11 = (uVar13 & 0xffffffff) * uVar3 + uVar13;
          fVar15 = this->fElem[lVar11];
          if ((ABS(fVar15) < 1e-06) &&
             ((pcVar7 = "static::BackSub(SubstitutionLU) <Matrix is singular", fVar15 == 0.0 ||
              (pcVar7 = 
               "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus...",
              1e-12 < ABS(B->fElem[lVar10 + uVar13] - fVar15))))) {
            Error(pcVar7 + 8,(char *)0x0);
          }
          B->fElem[lVar10 + uVar13] = B->fElem[lVar10 + uVar13] / this->fElem[lVar11];
          lVar14 = lVar14 + 1;
          lVar9 = lVar9 + -4;
          bVar6 = 1 < (long)uVar8;
          uVar8 = uVar13;
        } while (bVar6);
      }
      local_58 = local_58 + 1;
    } while (local_58 != uVar2);
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}